

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pending_with_parameters.cpp
# Opt level: O3

void CreateSimpleTable(Connection *con)

{
  AssertionHandler catchAssertionHandler;
  ExprLhs<bool> local_d9;
  SourceLineInfo local_d8;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> local_c8;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> local_c0;
  StringRef local_b8;
  char local_a8 [16];
  AssertionHandler local_98;
  StringRef local_50;
  StringRef local_40;
  
  local_b8.m_start = "REQUIRE";
  local_b8.m_size = 7;
  local_d8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_pending_with_parameters.cpp"
  ;
  local_d8.line = 8;
  Catch::StringRef::StringRef(&local_40,"NO_FAIL((con.Query(\"CREATE TABLE a (i TINYINT)\")))");
  Catch::AssertionHandler::AssertionHandler(&local_98,&local_b8,&local_d8,local_40,Normal);
  local_b8.m_start = local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"CREATE TABLE a (i TINYINT)","");
  duckdb::Connection::Query((string *)&local_d8);
  local_c0._M_head_impl = (QueryResult *)local_d8.file;
  local_d8.file = (char *)0x0;
  local_d9.m_lhs =
       duckdb::NO_FAIL((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                        *)&local_c0);
  Catch::AssertionHandler::handleExpr<bool>(&local_98,&local_d9);
  if (local_c0._M_head_impl != (QueryResult *)0x0) {
    (**(code **)(*(long *)local_c0._M_head_impl + 8))();
  }
  local_c0._M_head_impl = (QueryResult *)0x0;
  if ((long *)local_d8.file != (long *)0x0) {
    (**(code **)(*(long *)local_d8.file + 8))();
  }
  local_d8.file = (char *)0x0;
  if (local_b8.m_start != local_a8) {
    operator_delete(local_b8.m_start);
  }
  Catch::AssertionHandler::complete(&local_98);
  if (local_98.m_completed == false) {
    (*(local_98.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  local_b8.m_start = "REQUIRE";
  local_b8.m_size = 7;
  local_d8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_pending_with_parameters.cpp"
  ;
  local_d8.line = 9;
  Catch::StringRef::StringRef
            (&local_50,"NO_FAIL((con.Query(\"INSERT INTO a VALUES (11), (12), (13)\")))");
  Catch::AssertionHandler::AssertionHandler(&local_98,&local_b8,&local_d8,local_50,Normal);
  local_b8.m_start = local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"INSERT INTO a VALUES (11), (12), (13)","");
  duckdb::Connection::Query((string *)&local_d8);
  local_c8._M_head_impl = (QueryResult *)local_d8.file;
  local_d8.file = (char *)0x0;
  local_d9.m_lhs =
       duckdb::NO_FAIL((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                        *)&local_c8);
  Catch::AssertionHandler::handleExpr<bool>(&local_98,&local_d9);
  if (local_c8._M_head_impl != (QueryResult *)0x0) {
    (**(code **)(*(long *)local_c8._M_head_impl + 8))();
  }
  local_c8._M_head_impl = (QueryResult *)0x0;
  if ((long *)local_d8.file != (long *)0x0) {
    (**(code **)(*(long *)local_d8.file + 8))();
  }
  local_d8.file = (char *)0x0;
  if (local_b8.m_start != local_a8) {
    operator_delete(local_b8.m_start);
  }
  Catch::AssertionHandler::complete(&local_98);
  if (local_98.m_completed == false) {
    (*(local_98.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  return;
}

Assistant:

static void CreateSimpleTable(Connection &con) {
	REQUIRE_NO_FAIL(con.Query("CREATE TABLE a (i TINYINT)"));
	REQUIRE_NO_FAIL(con.Query("INSERT INTO a VALUES (11), (12), (13)"));
}